

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>>
::find_or_prepare_insert_non_soo<google::protobuf::FileDescriptor_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>>
          *this,FileDescriptor **key)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  ushort uVar4;
  char cVar5;
  uint32_t uVar6;
  uint uVar7;
  size_t hash;
  bool bVar8;
  size_t i;
  ushort uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i match;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined1 auVar13 [16];
  iterator iVar29;
  FindInfo FVar30;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_70;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  hash = HashEq<google::protobuf::FileDescriptor_const*,void>::Hash::operator()((Hash *)this,key);
  probe(&local_70,(CommonFields *)this,hash);
  lVar3 = *(long *)(this + 0x10);
  auVar11 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar11 = pshuflw(auVar11,auVar11,0);
  uVar10 = auVar11._0_4_;
  auVar11._4_4_ = uVar10;
  auVar11._0_4_ = uVar10;
  auVar11._8_4_ = uVar10;
  auVar11._12_4_ = uVar10;
  do {
    pcVar2 = (char *)(lVar3 + local_70.offset_);
    auVar12[0] = -(auVar11[0] == *pcVar2);
    auVar12[1] = -(auVar11[1] == pcVar2[1]);
    auVar12[2] = -(auVar11[2] == pcVar2[2]);
    auVar12[3] = -(auVar11[3] == pcVar2[3]);
    auVar12[4] = -(auVar11[4] == pcVar2[4]);
    auVar12[5] = -(auVar11[5] == pcVar2[5]);
    auVar12[6] = -(auVar11[6] == pcVar2[6]);
    auVar12[7] = -(auVar11[7] == pcVar2[7]);
    auVar12[8] = -(auVar11[8] == pcVar2[8]);
    auVar12[9] = -(auVar11[9] == pcVar2[9]);
    auVar12[10] = -(auVar11[10] == pcVar2[10]);
    auVar12[0xb] = -(auVar11[0xb] == pcVar2[0xb]);
    auVar12[0xc] = -(auVar11[0xc] == pcVar2[0xc]);
    auVar12[0xd] = -(auVar11[0xd] == pcVar2[0xd]);
    auVar12[0xe] = -(auVar11[0xe] == pcVar2[0xe]);
    auVar12[0xf] = -(auVar11[0xf] == pcVar2[0xf]);
    cVar5 = *pcVar2;
    cVar14 = pcVar2[1];
    cVar15 = pcVar2[2];
    cVar16 = pcVar2[3];
    cVar17 = pcVar2[4];
    cVar18 = pcVar2[5];
    cVar19 = pcVar2[6];
    cVar20 = pcVar2[7];
    cVar21 = pcVar2[8];
    cVar22 = pcVar2[9];
    cVar23 = pcVar2[10];
    cVar24 = pcVar2[0xb];
    cVar25 = pcVar2[0xc];
    cVar26 = pcVar2[0xd];
    cVar27 = pcVar2[0xe];
    cVar28 = pcVar2[0xf];
    for (uVar9 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
        ; uVar9 != 0; uVar9 = uVar9 - 1 & uVar9) {
      local_58 = cVar5;
      cStack_57 = cVar14;
      cStack_56 = cVar15;
      cStack_55 = cVar16;
      cStack_54 = cVar17;
      cStack_53 = cVar18;
      cStack_52 = cVar19;
      cStack_51 = cVar20;
      cStack_50 = cVar21;
      cStack_4f = cVar22;
      cStack_4e = cVar23;
      cStack_4d = cVar24;
      cStack_4c = cVar25;
      cStack_4b = cVar26;
      cStack_4a = cVar27;
      cStack_49 = cVar28;
      local_48 = auVar11;
      uVar6 = TrailingZeros<unsigned_short>(uVar9);
      i = uVar6 + local_70.offset_ & local_70.mask_;
      if (*(FileDescriptor **)(*(long *)(this + 0x18) + i * 0x50) == *key) {
        bVar8 = false;
        goto LAB_00259bb3;
      }
      auVar11 = local_48;
      cVar5 = local_58;
      cVar14 = cStack_57;
      cVar15 = cStack_56;
      cVar16 = cStack_55;
      cVar17 = cStack_54;
      cVar18 = cStack_53;
      cVar19 = cStack_52;
      cVar20 = cStack_51;
      cVar21 = cStack_50;
      cVar22 = cStack_4f;
      cVar23 = cStack_4e;
      cVar24 = cStack_4d;
      cVar25 = cStack_4c;
      cVar26 = cStack_4b;
      cVar27 = cStack_4a;
      cVar28 = cStack_49;
    }
    auVar13[0] = -(cVar5 == -0x80);
    auVar13[1] = -(cVar14 == -0x80);
    auVar13[2] = -(cVar15 == -0x80);
    auVar13[3] = -(cVar16 == -0x80);
    auVar13[4] = -(cVar17 == -0x80);
    auVar13[5] = -(cVar18 == -0x80);
    auVar13[6] = -(cVar19 == -0x80);
    auVar13[7] = -(cVar20 == -0x80);
    auVar13[8] = -(cVar21 == -0x80);
    auVar13[9] = -(cVar22 == -0x80);
    auVar13[10] = -(cVar23 == -0x80);
    auVar13[0xb] = -(cVar24 == -0x80);
    auVar13[0xc] = -(cVar25 == -0x80);
    auVar13[0xd] = -(cVar26 == -0x80);
    auVar13[0xe] = -(cVar27 == -0x80);
    auVar13[0xf] = -(cVar28 == -0x80);
    uVar9 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf;
    if (uVar9 != 0) {
      cVar5 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (*(ulong *)this,hash,*(ctrl_t **)(this + 0x10));
      if (cVar5 == '\0') {
        uVar7 = TrailingZeros<unsigned_short>(uVar9);
      }
      else {
        uVar4 = 0xf;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar7 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      FVar30.offset = uVar7 + local_70.offset_ & local_70.mask_;
      FVar30.probe_length = local_70.index_;
      i = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                    ((CommonFields *)this,hash,FVar30,(PolicyFunctions *)GetPolicyFunctions()::value
                    );
      bVar8 = true;
LAB_00259bb3:
      iVar29 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>_>_>
                              *)this,i);
      __return_storage_ptr__->first = iVar29;
      __return_storage_ptr__->second = bVar8;
      return __return_storage_ptr__;
    }
    uVar1 = local_70.index_ + 0x10;
    local_70.offset_ = local_70.offset_ + local_70.index_ + 0x10 & local_70.mask_;
    local_70.index_ = uVar1;
    if (*(ulong *)this < uVar1) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>, K = const google::protobuf::FileDescriptor *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }